

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::insert(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
         *this,value_type *value)

{
  pair<unsigned_long_long,_int> *key;
  node *pnVar1;
  int iVar2;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 extraout_var_01;
  node **ppnVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  node **ppnVar17;
  ulong uVar18;
  int local_9ac;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  lnk;
  pair<unsigned_long_long,_int> tmpk [100];
  long tmpv [100];
  node *pnVar3;
  undefined4 extraout_var_00;
  
  uVar8 = (value->first).first;
  iVar12 = (value->first).second;
  lVar7 = value->second;
  lVar15 = (long)this->depth;
  if (lVar15 == 0) {
    iVar2 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
    this->root = extraout_RDX;
    this->depth = 1;
    *(undefined4 *)(plVar4 + 299) = 1;
    plVar4[0x65] = uVar8;
    *(int *)(plVar4 + 0x66) = iVar12;
    *plVar4 = lVar7;
    plVar4[100] = -1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
  }
  else {
    uVar6 = lVar15 << 2;
    uVar18 = lVar15 * 8;
    if (this->depth < 0) {
      uVar6 = 0xffffffffffffffff;
      uVar18 = 0xffffffffffffffff;
    }
    pos = (locType *)operator_new__(uVar18);
    *pos = 0;
    p = (node **)operator_new__(uVar18);
    pp = (int *)operator_new__(uVar6);
    *pos = this->root;
    lVar13 = 0;
    ppnVar17 = p;
    while( true ) {
      lVar11 = (long)(int)lVar15;
      if (lVar11 <= lVar13) break;
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + lVar13);
      pnVar3 = (node *)CONCAT44(extraout_var,iVar2);
      p[lVar13] = pnVar3;
      uVar14 = pnVar3->sz;
      if (pnVar3->sz < 1) {
        uVar14 = 0;
      }
      ppnVar17 = (node **)(ulong)uVar14;
      piVar9 = &pnVar3->keyvalue[0].second;
      for (ppnVar5 = (node **)0x0; ppnVar17 != ppnVar5; ppnVar5 = (node **)((long)ppnVar5 + 1)) {
        if ((uVar8 <= ((pair<unsigned_long_long,_int> *)(piVar9 + -2))->first) &&
           ((uVar8 < ((pair<unsigned_long_long,_int> *)(piVar9 + -2))->first || (iVar12 <= *piVar9))
           )) {
          lVar15 = (long)this->depth;
          if (lVar15 + -1 <= lVar13) {
            ppnVar17 = (node **)((ulong)ppnVar5 & 0xffffffff);
            goto LAB_0010ca8d;
          }
          if (((pair<unsigned_long_long,_int> *)(piVar9 + -2))->first <= uVar8) {
            if (((pair<unsigned_long_long,_int> *)(piVar9 + -2))->first < uVar8) {
              ppnVar5 = (node **)(ulong)((int)ppnVar5 + 1);
            }
            else if (*piVar9 <= iVar12) {
              ppnVar5 = (node **)((long)ppnVar5 + 1);
            }
          }
          ppnVar17 = (node **)((ulong)ppnVar5 & 0xffffffff);
          goto LAB_0010ca82;
        }
        piVar9 = piVar9 + 4;
      }
      lVar15 = (long)this->depth;
      if (lVar13 < lVar15 + -1) {
LAB_0010ca82:
        (pos + lVar13)[1] = (pnVar3->field_0).val[(int)ppnVar17];
      }
LAB_0010ca8d:
      pp[lVar13] = (int)ppnVar17;
      lVar13 = lVar13 + 1;
    }
    pnVar3 = p[lVar11 + -1];
    iVar2 = pnVar3->sz;
    iVar16 = (int)ppnVar17;
    if (iVar16 < iVar2) {
      uVar18 = pnVar3->keyvalue[iVar16].first;
      if ((uVar18 <= uVar8) && ((uVar18 < uVar8 || (pnVar3->keyvalue[iVar16].second <= iVar12)))) {
        operator_delete__(p);
        operator_delete__(pp);
        operator_delete__(pos);
        return false;
      }
    }
    if (iVar16 == 0) {
      for (uVar14 = (int)lVar15 - 2; -1 < (int)uVar14; uVar14 = uVar14 - 1) {
        lVar15 = (long)pp[uVar14];
        if (lVar15 != 0) {
          uVar18 = pnVar3->keyvalue[0].first;
          pnVar1 = p[uVar14];
          uVar6 = pnVar1->keyvalue[lVar15 + -1].first;
          if (((uVar6 <= uVar18) && (uVar18 <= uVar6)) &&
             (pnVar1->keyvalue[lVar15 + -1].second == pnVar3->keyvalue[0].second)) {
            pnVar1->keyvalue[lVar15 + -1].first = uVar8;
            pnVar1->keyvalue[lVar15 + -1].second = iVar12;
            (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              )._vptr_FileManager_Base[3])(this->file,pos + uVar14);
            iVar2 = p[lVar11 + -1]->sz;
            break;
          }
        }
      }
    }
    if (iVar2 < 99) {
      lVar10 = (long)iVar2;
      lVar15 = (long)iVar16;
      lVar13 = lVar10 * 0x10 + 0x330;
      for (; pnVar3 = p[lVar11 + -1], lVar15 < lVar10; lVar10 = lVar10 + -1) {
        *(undefined8 *)((long)pnVar3 + lVar13 + -8) = *(undefined8 *)((long)pnVar3 + lVar13 + -0x18)
        ;
        *(undefined4 *)((long)&pnVar3->field_0 + lVar13) =
             *(undefined4 *)((long)pnVar3 + lVar13 + -0x10);
        (pnVar3->field_0).val[lVar10] = *(long *)((long)pnVar3 + lVar10 * 8 + -8);
        lVar13 = lVar13 + -0x10;
      }
      pnVar3->keyvalue[lVar15].first = uVar8;
      pnVar3->keyvalue[lVar15].second = iVar12;
      (pnVar3->field_0).val[lVar15] = lVar7;
      p[lVar11 + -1]->sz = p[lVar11 + -1]->sz + 1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    }
    else {
      lVar13 = (long)iVar16;
      lVar15 = 8;
      do {
        *(undefined8 *)((long)tmpk + lVar15 + -8) = 0;
        *(undefined4 *)((long)&tmpk[0].first + lVar15) = 0;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x648);
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[1])();
      lnk.first = (node *)CONCAT44(extraout_var_01,iVar2);
      uVar6 = 0;
      uVar18 = (ulong)ppnVar17 & 0xffffffff;
      if (iVar16 < 1) {
        uVar18 = uVar6;
      }
      for (; uVar18 * 8 != uVar6; uVar6 = uVar6 + 8) {
        pnVar3 = p[lVar11 + -1];
        *(undefined8 *)((long)tmpv + uVar6) = *(undefined8 *)((long)&pnVar3->field_0 + uVar6);
        *(undefined8 *)((long)&tmpk[0].first + uVar6 * 2) =
             *(undefined8 *)((long)&pnVar3->keyvalue[0].first + uVar6 * 2);
        *(undefined4 *)((long)&tmpk[0].second + uVar6 * 2) =
             *(undefined4 *)((long)&pnVar3->keyvalue[0].second + uVar6 * 2);
      }
      tmpv[lVar13] = lVar7;
      tmpk[lVar13].first = uVar8;
      lVar7 = lVar13 * 8;
      for (; *(int *)((long)&tmpk[0].second + lVar7 * 2) = iVar12, lVar13 < 99; lVar13 = lVar13 + 1)
      {
        pnVar3 = p[lVar11 + -1];
        *(undefined8 *)((long)tmpv + lVar7 + 8) = *(undefined8 *)((long)&pnVar3->field_0 + lVar7);
        *(undefined8 *)((long)&tmpk[1].first + lVar7 * 2) =
             *(undefined8 *)((long)&pnVar3->keyvalue[0].first + lVar7 * 2);
        iVar12 = *(int *)((long)&pnVar3->keyvalue[0].second + lVar7 * 2);
        lVar7 = lVar7 + 8;
      }
      pnVar3 = p[lVar11 + -1];
      (lnk.first)->nxt = pnVar3->nxt;
      pnVar3->sz = 0x32;
      uVar8 = 0x32;
      lVar7 = 0;
      lVar15 = 0;
      while( true ) {
        lVar13 = (long)(int)uVar8;
        if (lVar13 <= lVar15) break;
        (pnVar3->field_0).val[lVar15] = tmpv[lVar15];
        pnVar3 = p[lVar11 + -1];
        *(undefined8 *)((long)&pnVar3->keyvalue[0].first + lVar7) =
             *(undefined8 *)((long)&tmpk[0].first + lVar7);
        *(undefined4 *)((long)&pnVar3->keyvalue[0].second + lVar7) =
             *(undefined4 *)((long)&tmpk[0].second + lVar7);
        lVar15 = lVar15 + 1;
        uVar8 = (ulong)(uint)pnVar3->sz;
        lVar7 = lVar7 + 0x10;
      }
      pnVar3->nxt = extraout_RDX_00;
      key = (lnk.first)->keyvalue;
      lVar7 = (long)(int)uVar8;
      lVar15 = 0;
      for (; lVar13 < 100; lVar13 = lVar13 + 1) {
        *(undefined8 *)((long)lnk.first + lVar15 + (long)(int)uVar8 * -8 + lVar7 * 8) =
             *(undefined8 *)((long)tmpv + lVar15 + lVar7 * 8);
        uVar8 = (ulong)p[lVar11 + -1]->sz;
        lVar10 = uVar8 * -0x10 + lVar7 * 0x10;
        *(undefined8 *)((long)lnk.first + lVar15 * 2 + lVar10 + 0x328) =
             *(undefined8 *)((long)&tmpk[lVar7].first + lVar15 * 2);
        *(undefined4 *)((long)lnk.first + lVar15 * 2 + lVar10 + 0x330) =
             *(undefined4 *)((long)&tmpk[lVar7].second + lVar15 * 2);
        lVar15 = lVar15 + 8;
      }
      (lnk.first)->sz = 100 - (int)uVar8;
      lnk.second = extraout_RDX_00;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
      local_9ac = this->depth + -2;
      insertnonleaf(this,key,&local_9ac,p,pp,pos,lnk.second);
    }
    operator_delete__(p);
    operator_delete__(pp);
    operator_delete__(pos);
    this->siz = this->siz + 1;
  }
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }